

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void ARGBCopyYToAlphaRow_AVX2(uint8_t *src,uint8_t *dst,int width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  undefined1 auVar5 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int width_local;
  uint8_t *dst_local;
  uint8_t *src_local;
  
  auVar5 = vpcmpeqb_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar5 = vpsrld_avx2(auVar5,8);
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)src;
    auVar6 = vpmovzxbd_avx2(auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)((long)src + 8);
    auVar7 = vpmovzxbd_avx2(auVar2);
    src = (uint8_t *)((long)src + 0x10);
    auVar6 = vpslld_avx2(auVar6,0x18);
    auVar7 = vpslld_avx2(auVar7,0x18);
    auVar6 = vpblendvb_avx2(auVar6,*(undefined1 (*) [32])dst,auVar5);
    auVar7 = vpblendvb_avx2(auVar7,*(undefined1 (*) [32])((long)dst + 0x20),auVar5);
    *(undefined1 (*) [32])dst = auVar6;
    *(undefined1 (*) [32])((long)dst + 0x20) = auVar7;
    dst = (uint8_t *)((long)dst + 0x40);
    iVar4 = width + -0x10;
    bVar3 = 0xf < width;
    width = iVar4;
  } while (iVar4 != 0 && bVar3);
  return;
}

Assistant:

void ARGBCopyYToAlphaRow_AVX2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "vpcmpeqb    %%ymm0,%%ymm0,%%ymm0          \n"
      "vpsrld      $0x8,%%ymm0,%%ymm0            \n"

      LABELALIGN
      "1:                                        \n"
      "vpmovzxbd   (%0),%%ymm1                   \n"
      "vpmovzxbd   0x8(%0),%%ymm2                \n"
      "lea         0x10(%0),%0                   \n"
      "vpslld      $0x18,%%ymm1,%%ymm1           \n"
      "vpslld      $0x18,%%ymm2,%%ymm2           \n"
      "vpblendvb   %%ymm0,(%1),%%ymm1,%%ymm1     \n"
      "vpblendvb   %%ymm0,0x20(%1),%%ymm2,%%ymm2 \n"
      "vmovdqu     %%ymm1,(%1)                   \n"
      "vmovdqu     %%ymm2,0x20(%1)               \n"
      "lea         0x40(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}